

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O3

void __thiscall EmitPrettyPrint::setMaxLineSize(EmitPrettyPrint *this,int4 val)

{
  LowlevelError *this_00;
  string local_40;
  
  if (0xffffd902 < val - 0x2711U) {
    this->maxlinesize = val;
    circularqueue<int>::setMax(&this->scanqueue,val * 3);
    circularqueue<TokenSplit>::setMax(&this->tokqueue,val * 3);
    this->spaceremain = this->maxlinesize;
    (*(this->super_EmitXml)._vptr_EmitXml[0x1e])(this);
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Bad maximum line size","");
  LowlevelError::LowlevelError(this_00,&local_40);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void EmitPrettyPrint::setMaxLineSize(int4 val)

{
  if ((val<20)||(val>10000))
    throw LowlevelError("Bad maximum line size");
  maxlinesize = val;
  scanqueue.setMax(3*val);
  tokqueue.setMax(3*val);
  spaceremain = maxlinesize;
  clear();
}